

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

InternalParseResult * __thiscall
Catch::clara::detail::Parser::parse
          (InternalParseResult *__return_storage_ptr__,Parser *this,string *exeName,
          TokenStream *tokens)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *pvVar2;
  pointer pOVar3;
  pointer pAVar4;
  long *plVar5;
  bool bVar6;
  bool bVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  ulong *puVar15;
  ulong uVar16;
  ulong uVar17;
  const_iterator __begin3;
  pointer pOVar18;
  pointer pAVar19;
  long lVar20;
  undefined4 uVar21;
  undefined4 uVar24;
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  BasicResult<Catch::clara::detail::ParseState> result;
  ParserInfo parseInfos [512];
  undefined1 local_2170 [64];
  char *local_2130;
  size_type local_2128;
  char local_2120;
  undefined7 uStack_211f;
  undefined8 uStack_2118;
  string *local_2110;
  undefined1 local_2108 [16];
  undefined1 local_20f8 [40];
  ulong local_20d0;
  undefined1 local_20c8 [16];
  undefined1 auStack_20b8 [24];
  vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> local_20a0;
  undefined1 *local_2088 [2];
  undefined1 local_2078 [16];
  ParserResult local_2068;
  ulong local_2038 [1025];
  undefined1 auVar22 [16];
  
  pOVar18 = (this->m_options).
            super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pOVar3 = (this->m_options).
           super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pAVar4 = (this->m_args).
           super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pAVar19 = (this->m_args).
            super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar13 = (long)pAVar4 - (long)pAVar19;
  local_20d0 = (lVar13 >> 5) * -0x5555555555555555 +
               ((long)pOVar3 - (long)pOVar18 >> 3) * -0x1111111111111111;
  local_2110 = exeName;
  if (0x1ff < local_20d0) {
    __assert_fail("totalParsers < 512",
                  "/workspace/llm4binary/github/license_c_cmakelists/philipp-classen[P]CppQuickCheck/test/catch.hpp"
                  ,0x2585,
                  "virtual InternalParseResult Catch::clara::detail::Parser::parse(const std::string &, const TokenStream &) const"
                 );
  }
  puVar15 = local_2038;
  lVar20 = 0;
  memset(puVar15,0,0x2000);
  if (pOVar18 != pOVar3) {
    lVar20 = 0;
    do {
      lVar20 = lVar20 + 1;
      *puVar15 = (ulong)pOVar18;
      pOVar18 = pOVar18 + 1;
      puVar15 = puVar15 + 2;
    } while (pOVar18 != pOVar3);
  }
  if (pAVar19 != pAVar4) {
    uVar14 = lVar13 - 0x60;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar14;
    uVar21 = SUB164(auVar27 * ZEXT816(0xaaaaaaaaaaaaaaab),8);
    uVar24 = (undefined4)(uVar14 / 0x180000000);
    auVar22._0_8_ = CONCAT44(uVar24,uVar21);
    auVar22._8_4_ = uVar21;
    auVar22._12_4_ = uVar24;
    auVar23._0_8_ = auVar22._0_8_ >> 6;
    auVar23._8_8_ = auVar22._8_8_ >> 6;
    puVar15 = local_2038 + lVar20 * 2 + 2;
    uVar17 = 0;
    auVar23 = auVar23 ^ _DAT_001ef0c0;
    do {
      auVar25._8_4_ = (int)pAVar19;
      auVar25._0_8_ = pAVar19;
      auVar25._12_4_ = (int)((ulong)pAVar19 >> 0x20);
      auVar26._8_4_ = (int)uVar17;
      auVar26._0_8_ = uVar17;
      auVar26._12_4_ = (int)(uVar17 >> 0x20);
      auVar27 = (auVar26 | _DAT_001ef0b0) ^ _DAT_001ef0c0;
      if ((bool)(~(auVar27._4_4_ == auVar23._4_4_ && auVar23._0_4_ < auVar27._0_4_ ||
                  auVar23._4_4_ < auVar27._4_4_) & 1)) {
        puVar15[-2] = (ulong)pAVar19;
      }
      if ((auVar27._12_4_ != auVar23._12_4_ || auVar27._8_4_ <= auVar23._8_4_) &&
          auVar27._12_4_ <= auVar23._12_4_) {
        *puVar15 = auVar25._8_8_ + 0x60;
      }
      uVar17 = uVar17 + 2;
      pAVar19 = pAVar19 + 2;
      puVar15 = puVar15 + 4;
    } while ((uVar14 / 0x60 + 2 & 0xfffffffffffffffe) != uVar17);
  }
  ExeName::set(&local_2068,&this->m_exeName,local_2110);
  local_2068.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase.
  _vptr_ResultBase = (_func_int **)&PTR__BasicResult_00228298;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2068.m_errorMessage._M_dataplus._M_p != &local_2068.m_errorMessage.field_2) {
    operator_delete(local_2068.m_errorMessage._M_dataplus._M_p);
  }
  local_2068.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase.
  _vptr_ResultBase = (_func_int **)&PTR__ResultValueBase_002282f0;
  pvVar2 = (vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
           (auStack_20b8 + 8);
  local_20c8._0_4_ = 1;
  local_20c8._8_8_ = (tokens->it)._M_current;
  auStack_20b8._0_8_ = (tokens->itEnd)._M_current;
  std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::vector
            (pvVar2,&tokens->m_tokenBuffer);
  local_2170._8_4_ = Ok;
  local_2170._0_8_ = &PTR__ResultValueBase_00228190;
  local_2170._16_4_ = local_20c8._0_4_;
  local_2170._24_8_ = local_20c8._8_8_;
  local_2170._32_8_ = auStack_20b8._0_8_;
  std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::vector
            ((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
             (local_2170 + 0x28),pvVar2);
  local_2170._0_8_ = &PTR__BasicResult_00228138;
  local_2130 = &local_2120;
  local_2128 = 0;
  local_2120 = '\0';
  std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::~vector
            (pvVar2);
  paVar1 = &(__return_storage_ptr__->m_errorMessage).field_2;
  local_20f8._32_8_ =
       (long)&(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
              field_0 + 8;
  pvVar2 = &(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
            field_0.m_value.m_remainingTokens.m_tokenBuffer;
  do {
    (**(_func_int **)(local_2170._0_8_ + 0x10))
              ((ResultValueBase<Catch::clara::detail::ParseState> *)local_2170);
    local_20c8._0_8_ = local_2170._24_8_;
    local_20c8._8_8_ = local_2170._32_8_;
    std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::vector
              ((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
               auStack_20b8,
               (vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
               (local_2170 + 0x28));
    uVar11 = auStack_20b8._8_8_;
    uVar10 = auStack_20b8._0_8_;
    uVar9 = local_20c8._8_8_;
    uVar8 = local_20c8._0_8_;
    std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::~vector
              ((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
               auStack_20b8);
    if ((uVar10 == uVar11) && (uVar8 == uVar9)) {
      (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
      super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__ResultBase_00228110;
      (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
      super_ResultBase.m_type = local_2170._8_4_;
      (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
      super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__ResultValueBase_00228190;
      if (local_2170._8_4_ == Ok) {
        (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).field_0.
        m_value.m_type = local_2170._16_4_;
        (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).field_0.
        m_value.m_remainingTokens.it._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2170._24_8_;
        (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).field_0.
        m_value.m_remainingTokens.itEnd._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2170._32_8_;
        std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
        vector(pvVar2,(vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
                       *)(local_2170 + 0x28));
      }
      (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
      super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_00228138;
      (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)paVar1;
      if (local_2130 == &local_2120) {
        paVar1->_M_allocated_capacity = CONCAT71(uStack_211f,local_2120);
        *(undefined8 *)((long)&(__return_storage_ptr__->m_errorMessage).field_2 + 8) = uStack_2118;
      }
      else {
        (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = local_2130;
        (__return_storage_ptr__->m_errorMessage).field_2._M_allocated_capacity =
             CONCAT71(uStack_211f,local_2120);
      }
      (__return_storage_ptr__->m_errorMessage)._M_string_length = local_2128;
      local_2128 = 0;
      local_2120 = '\0';
      local_2130 = &local_2120;
      break;
    }
    if (local_20d0 == 0) {
      iVar12 = 8;
      bVar7 = false;
    }
    else {
      bVar7 = false;
      puVar15 = local_2038 + 1;
      uVar14 = local_20d0;
      do {
        plVar5 = (long *)puVar15[-1];
        lVar13 = (**(code **)(*plVar5 + 0x20))(plVar5);
        if ((lVar13 == 0) ||
           (uVar17 = *puVar15, uVar16 = (**(code **)(*plVar5 + 0x20))(plVar5), uVar17 < uVar16)) {
          (**(_func_int **)(local_2170._0_8_ + 0x10))
                    ((ResultValueBase<Catch::clara::detail::ParseState> *)local_2170);
          local_2108._0_8_ = local_2170._24_8_;
          local_2108._8_8_ = local_2170._32_8_;
          std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
          vector((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
                  *)(local_2108 + 0x10),
                 (vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
                  *)(local_2170 + 0x28));
          (**(code **)(*plVar5 + 0x18))
                    ((ResultValueBase<Catch::clara::detail::ParseState> *)local_20c8,plVar5,
                     local_2110,local_2108);
          ResultValueBase<Catch::clara::detail::ParseState>::operator=
                    ((ResultValueBase<Catch::clara::detail::ParseState> *)local_2170,
                     (ResultValueBase<Catch::clara::detail::ParseState> *)local_20c8);
          ::std::__cxx11::string::operator=((string *)&local_2130,(string *)local_2088);
          local_20c8._0_8_ = &PTR__BasicResult_00228138;
          if (local_2088[0] != local_2078) {
            operator_delete(local_2088[0]);
          }
          local_20c8._0_8_ = &PTR__ResultValueBase_00228190;
          if (local_20c8._8_4_ == Ok) {
            std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
            ~vector(&local_20a0);
          }
          std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
          ~vector((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
                   *)(local_2108 + 0x10));
          if (local_2170._8_4_ == Ok) {
            (**(_func_int **)(local_2170._0_8_ + 0x10))
                      ((ResultValueBase<Catch::clara::detail::ParseState> *)local_2170);
            if (local_2170._16_4_ == NoMatch) goto LAB_001a84be;
            *puVar15 = *puVar15 + 1;
            iVar12 = 8;
            bVar7 = true;
          }
          else {
            (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
            super_ResultBase.m_type = local_2170._8_4_;
            (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
            super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_00228138;
            (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)paVar1;
            if (local_2130 == &local_2120) {
              paVar1->_M_allocated_capacity = CONCAT71(uStack_211f,local_2120);
              *(undefined8 *)((long)&(__return_storage_ptr__->m_errorMessage).field_2 + 8) =
                   uStack_2118;
            }
            else {
              (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = local_2130;
              (__return_storage_ptr__->m_errorMessage).field_2._M_allocated_capacity =
                   CONCAT71(uStack_211f,local_2120);
            }
            (__return_storage_ptr__->m_errorMessage)._M_string_length = local_2128;
            local_2128 = 0;
            local_2120 = '\0';
            iVar12 = 1;
            local_2130 = &local_2120;
          }
          bVar6 = false;
        }
        else {
LAB_001a84be:
          iVar12 = 0;
          bVar6 = true;
        }
        if (!bVar6) goto LAB_001a8522;
        puVar15 = puVar15 + 2;
        uVar14 = uVar14 - 1;
      } while (uVar14 != 0);
      iVar12 = 8;
    }
LAB_001a8522:
    if (iVar12 == 8) {
      (**(_func_int **)(local_2170._0_8_ + 0x10))
                ((ResultValueBase<Catch::clara::detail::ParseState> *)local_2170);
      if (local_2170._16_4_ == ShortCircuitAll) {
        (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
        super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__ResultBase_00228110;
        (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
        super_ResultBase.m_type = local_2170._8_4_;
        (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
        super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__ResultValueBase_00228190;
        if (local_2170._8_4_ == Ok) {
          (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).field_0.
          m_value.m_type = ShortCircuitAll;
          *(undefined8 *)local_20f8._32_8_ = local_2170._24_8_;
          *(undefined8 *)(local_20f8._32_8_ + 8) = local_2170._32_8_;
          std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
          vector(pvVar2,(vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
                         *)(local_2170 + 0x28));
        }
        (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
        super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_00228138;
        (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)paVar1;
        if (local_2130 == &local_2120) {
          paVar1->_M_allocated_capacity = CONCAT71(uStack_211f,local_2120);
          *(undefined8 *)((long)&(__return_storage_ptr__->m_errorMessage).field_2 + 8) = uStack_2118
          ;
        }
        else {
          (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = local_2130;
          (__return_storage_ptr__->m_errorMessage).field_2._M_allocated_capacity =
               CONCAT71(uStack_211f,local_2120);
        }
        (__return_storage_ptr__->m_errorMessage)._M_string_length = local_2128;
        local_2128 = 0;
        local_2120 = '\0';
        local_2130 = &local_2120;
      }
      else {
        iVar12 = 0;
        if (bVar7) goto LAB_001a86a6;
        (**(_func_int **)(local_2170._0_8_ + 0x10))
                  ((ResultValueBase<Catch::clara::detail::ParseState> *)local_2170);
        local_20c8._0_8_ = local_2170._24_8_;
        local_20c8._8_8_ = local_2170._32_8_;
        std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
        vector((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
               auStack_20b8,
               (vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
               (local_2170 + 0x28));
        if (auStack_20b8._0_8_ == auStack_20b8._8_8_) {
          __assert_fail("!m_tokenBuffer.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/philipp-classen[P]CppQuickCheck/test/catch.hpp"
                        ,0x22d7,"const Token *Catch::clara::detail::TokenStream::operator->() const"
                       );
        }
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2108,"Unrecognised token: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (auStack_20b8._0_8_ + 8));
        BasicResult<Catch::clara::detail::ParseState>::BasicResult
                  (__return_storage_ptr__,RuntimeError,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2108);
        if ((pointer)local_2108._0_8_ != (pointer)(local_2108 + 0x10)) {
          operator_delete((void *)local_2108._0_8_);
        }
        std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
        ~vector((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *
                )auStack_20b8);
      }
      iVar12 = 1;
    }
LAB_001a86a6:
  } while (iVar12 == 0);
  local_2170._0_8_ = &PTR__BasicResult_00228138;
  if (local_2130 != &local_2120) {
    operator_delete(local_2130);
  }
  local_2170._0_8_ = &PTR__ResultValueBase_00228190;
  if (local_2170._8_4_ == Ok) {
    std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::~vector
              ((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
               (local_2170 + 0x28));
  }
  return __return_storage_ptr__;
}

Assistant:

auto parse( std::string const& exeName, TokenStream const &tokens ) const -> InternalParseResult override {

            struct ParserInfo {
                ParserBase const* parser = nullptr;
                size_t count = 0;
            };
            const size_t totalParsers = m_options.size() + m_args.size();
            assert( totalParsers < 512 );
            // ParserInfo parseInfos[totalParsers]; // <-- this is what we really want to do
            ParserInfo parseInfos[512];

            {
                size_t i = 0;
                for (auto const &opt : m_options) parseInfos[i++].parser = &opt;
                for (auto const &arg : m_args) parseInfos[i++].parser = &arg;
            }

            m_exeName.set( exeName );

            auto result = InternalParseResult::ok( ParseState( ParseResultType::NoMatch, tokens ) );
            while( result.value().remainingTokens() ) {
                bool tokenParsed = false;

                for( size_t i = 0; i < totalParsers; ++i ) {
                    auto&  parseInfo = parseInfos[i];
                    if( parseInfo.parser->cardinality() == 0 || parseInfo.count < parseInfo.parser->cardinality() ) {
                        result = parseInfo.parser->parse(exeName, result.value().remainingTokens());
                        if (!result)
                            return result;
                        if (result.value().type() != ParseResultType::NoMatch) {
                            tokenParsed = true;
                            ++parseInfo.count;
                            break;
                        }
                    }
                }

                if( result.value().type() == ParseResultType::ShortCircuitAll )
                    return result;
                if( !tokenParsed )
                    return InternalParseResult::runtimeError( "Unrecognised token: " + result.value().remainingTokens()->token );
            }
            // !TBD Check missing required options
            return result;
        }